

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser * init_parse_object(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_object_name);
  parser_reg(p,"type sym tval",parse_object_type);
  parser_reg(p,"graphics char glyph sym color",parse_object_graphics);
  parser_reg(p,"level int level",parse_object_level);
  parser_reg(p,"weight int weight",parse_object_weight);
  parser_reg(p,"cost int cost",parse_object_cost);
  parser_reg(p,"alloc int common str minmax",parse_object_alloc);
  parser_reg(p,"attack rand hd rand to-h rand to-d",parse_object_attack);
  parser_reg(p,"armor int ac rand to-a",parse_object_armor);
  parser_reg(p,"charges rand charges",parse_object_charges);
  parser_reg(p,"pile int prob rand stack",parse_object_pile);
  parser_reg(p,"flags str flags",parse_object_flags);
  parser_reg(p,"power int power",parse_object_power);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_object_effect);
  parser_reg(p,"effect-yx int y int x",parse_object_effect_yx);
  parser_reg(p,"dice str dice",parse_object_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_object_expr);
  parser_reg(p,"msg str text",parse_object_msg);
  parser_reg(p,"vis-msg str text",parse_object_vis_msg);
  parser_reg(p,"time rand time",parse_object_time);
  parser_reg(p,"pval rand pval",parse_object_pval);
  parser_reg(p,"values str values",parse_object_values);
  parser_reg(p,"desc str text",parse_object_desc);
  parser_reg(p,"slay str code",parse_object_slay);
  parser_reg(p,"brand str code",parse_object_brand);
  parser_reg(p,"curse sym name int power",parse_object_curse);
  parser_reg(p,"act str name",parse_object_act);
  return p;
}

Assistant:

struct parser *init_parse_object(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_object_name);
	parser_reg(p, "type sym tval", parse_object_type);
	parser_reg(p, "graphics char glyph sym color", parse_object_graphics);
	parser_reg(p, "level int level", parse_object_level);
	parser_reg(p, "weight int weight", parse_object_weight);
	parser_reg(p, "cost int cost", parse_object_cost);
	parser_reg(p, "alloc int common str minmax", parse_object_alloc);
	parser_reg(p, "attack rand hd rand to-h rand to-d", parse_object_attack);
	parser_reg(p, "armor int ac rand to-a", parse_object_armor);
	parser_reg(p, "charges rand charges", parse_object_charges);
	parser_reg(p, "pile int prob rand stack", parse_object_pile);
	parser_reg(p, "flags str flags", parse_object_flags);
	parser_reg(p, "power int power", parse_object_power);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_object_effect);
	parser_reg(p, "effect-yx int y int x", parse_object_effect_yx);
	parser_reg(p, "dice str dice", parse_object_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_object_expr);
	parser_reg(p, "msg str text", parse_object_msg);
	parser_reg(p, "vis-msg str text", parse_object_vis_msg);
	parser_reg(p, "time rand time", parse_object_time);
	parser_reg(p, "pval rand pval", parse_object_pval);
	parser_reg(p, "values str values", parse_object_values);
	parser_reg(p, "desc str text", parse_object_desc);
	parser_reg(p, "slay str code", parse_object_slay);
	parser_reg(p, "brand str code", parse_object_brand);
	parser_reg(p, "curse sym name int power", parse_object_curse);
	parser_reg(p, "act str name", parse_object_act);
	return p;
}